

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heuristic_strand_array.h
# Opt level: O3

void __thiscall
embree::avx::HeuristicStrandSplit::split
          (HeuristicStrandSplit *this,Split *split,PrimInfoRange *set,PrimInfoRange *lset,
          PrimInfoRange *rset)

{
  long *plVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 *puVar9;
  undefined8 *puVar10;
  unsigned_long uVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  float fVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  long local_50;
  unsigned_long local_48;
  unsigned_long local_40;
  PrimInfoRange *local_38;
  
  if (INFINITY <= split->sah) {
    deterministic_order(this,&set->super_range<unsigned_long>);
    splitFallback(this,&set->super_range<unsigned_long>,lset,rset);
    return;
  }
  local_48 = (set->super_range<unsigned_long>)._begin;
  local_40 = (set->super_range<unsigned_long>)._end;
  local_50 = *(long *)(this + 8);
  puVar10 = (undefined8 *)(local_48 * 0x20 + local_50);
  puVar9 = (undefined8 *)(local_40 * 0x20 + local_50);
  local_98._8_4_ = 0x7f800000;
  local_98._0_8_ = 0x7f8000007f800000;
  local_98._12_4_ = 0x7f800000;
  local_b8._8_4_ = 0xff800000;
  local_b8._0_8_ = 0xff800000ff800000;
  local_b8._12_4_ = 0xff800000;
  local_c8._8_4_ = 0x7f800000;
  local_c8._0_8_ = 0x7f8000007f800000;
  local_c8._12_4_ = 0x7f800000;
  local_d8._8_4_ = 0xff800000;
  local_d8._0_8_ = 0xff800000ff800000;
  local_d8._12_4_ = 0xff800000;
  local_a8._8_4_ = 0x7f800000;
  local_a8._0_8_ = 0x7f8000007f800000;
  local_a8._12_4_ = 0x7f800000;
  local_e8._8_4_ = 0x7f800000;
  local_e8._0_8_ = 0x7f8000007f800000;
  local_e8._12_4_ = 0x7f800000;
  local_88._8_4_ = 0xff800000;
  local_88._0_8_ = 0xff800000ff800000;
  local_88._12_4_ = 0xff800000;
  local_f8._8_4_ = 0xff800000;
  local_f8._0_8_ = 0xff800000ff800000;
  local_f8._12_4_ = 0xff800000;
  local_38 = rset;
  do {
    puVar9 = puVar9 + -4;
    for (; puVar10 <= puVar9; puVar10 = puVar10 + 4) {
      plVar1 = *(long **)(*(long *)(*(long *)this + 0x1e8) +
                         (ulong)*(uint *)((long)puVar10 + 0xc) * 8);
      (**(code **)(*plVar1 + 0x1b8))(local_78,plVar1,*(undefined4 *)((long)puVar10 + 0x1c));
      auVar14 = vdpps_avx(local_78,local_78,0x7f);
      auVar12 = vrsqrtss_avx(auVar14,auVar14);
      fVar18 = auVar12._0_4_;
      auVar14 = ZEXT416((uint)(fVar18 * 1.5 + auVar14._0_4_ * -0.5 * fVar18 * fVar18 * fVar18));
      auVar14 = vshufps_avx(auVar14,auVar14,0);
      auVar12._0_4_ = local_78._0_4_ * auVar14._0_4_;
      auVar12._4_4_ = local_78._4_4_ * auVar14._4_4_;
      auVar12._8_4_ = local_78._8_4_ * auVar14._8_4_;
      auVar12._12_4_ = local_78._12_4_ * auVar14._12_4_;
      auVar14 = vdpps_avx(auVar12,(undefined1  [16])(split->axis0).field_0,0x7f);
      auVar12 = vdpps_avx(auVar12,(undefined1  [16])(split->axis1).field_0,0x7f);
      auVar19._8_4_ = 0x7fffffff;
      auVar19._0_8_ = 0x7fffffff7fffffff;
      auVar19._12_4_ = 0x7fffffff;
      auVar14 = vandps_avx(auVar14,auVar19);
      auVar12 = vandps_avx(auVar12,auVar19);
      if (auVar14._0_4_ <= auVar12._0_4_) break;
      plVar1 = *(long **)(*(long *)(*(long *)this + 0x1e8) +
                         (ulong)*(uint *)((long)puVar10 + 0xc) * 8);
      (**(code **)(*plVar1 + 0x1c8))(local_78,plVar1,*(undefined4 *)((long)puVar10 + 0x1c));
      local_a8 = vminps_avx(local_a8,local_78);
      local_d8 = vmaxps_avx(local_d8,local_68);
      auVar13._0_4_ = local_78._0_4_ + local_68._0_4_;
      auVar13._4_4_ = local_78._4_4_ + local_68._4_4_;
      auVar13._8_4_ = local_78._8_4_ + local_68._8_4_;
      auVar13._12_4_ = local_78._12_4_ + local_68._12_4_;
      local_e8 = vminps_avx(local_e8,auVar13);
      local_f8 = vmaxps_avx(local_f8,auVar13);
    }
    while( true ) {
      if (puVar9 < puVar10) {
        uVar11 = (long)puVar10 - local_50 >> 5;
        *(undefined8 *)&(lset->super_CentGeomBBox3fa).geomBounds.lower.field_0 = local_a8._0_8_;
        *(undefined8 *)((long)&(lset->super_CentGeomBBox3fa).geomBounds.lower.field_0 + 8) =
             local_a8._8_8_;
        *(undefined8 *)&(lset->super_CentGeomBBox3fa).geomBounds.upper.field_0 = local_d8._0_8_;
        *(undefined8 *)((long)&(lset->super_CentGeomBBox3fa).geomBounds.upper.field_0 + 8) =
             local_d8._8_8_;
        *(undefined8 *)&(lset->super_CentGeomBBox3fa).centBounds.lower.field_0 = local_e8._0_8_;
        *(undefined8 *)((long)&(lset->super_CentGeomBBox3fa).centBounds.lower.field_0 + 8) =
             local_e8._8_8_;
        *(undefined8 *)&(lset->super_CentGeomBBox3fa).centBounds.upper.field_0 = local_f8._0_8_;
        *(undefined8 *)((long)&(lset->super_CentGeomBBox3fa).centBounds.upper.field_0 + 8) =
             local_f8._8_8_;
        (lset->super_range<unsigned_long>)._begin = local_48;
        (lset->super_range<unsigned_long>)._end = uVar11;
        *(undefined8 *)&(local_38->super_CentGeomBBox3fa).geomBounds.lower.field_0 = local_c8._0_8_;
        *(undefined8 *)((long)&(local_38->super_CentGeomBBox3fa).geomBounds.lower.field_0 + 8) =
             local_c8._8_8_;
        *(undefined8 *)&(local_38->super_CentGeomBBox3fa).geomBounds.upper.field_0 = local_b8._0_8_;
        *(undefined8 *)((long)&(local_38->super_CentGeomBBox3fa).geomBounds.upper.field_0 + 8) =
             local_b8._8_8_;
        *(undefined8 *)&(local_38->super_CentGeomBBox3fa).centBounds.lower.field_0 = local_98._0_8_;
        *(undefined8 *)((long)&(local_38->super_CentGeomBBox3fa).centBounds.lower.field_0 + 8) =
             local_98._8_8_;
        *(undefined8 *)&(local_38->super_CentGeomBBox3fa).centBounds.upper.field_0 = local_88._0_8_;
        *(undefined8 *)((long)&(local_38->super_CentGeomBBox3fa).centBounds.upper.field_0 + 8) =
             local_88._8_8_;
        (local_38->super_range<unsigned_long>)._begin = uVar11;
        (local_38->super_range<unsigned_long>)._end = local_40;
        return;
      }
      plVar1 = *(long **)(*(long *)(*(long *)this + 0x1e8) +
                         (ulong)*(uint *)((long)puVar9 + 0xc) * 8);
      (**(code **)(*plVar1 + 0x1b8))(local_78,plVar1,*(undefined4 *)((long)puVar9 + 0x1c));
      auVar14 = vdpps_avx(local_78,local_78,0x7f);
      auVar12 = vrsqrtss_avx(auVar14,auVar14);
      fVar18 = auVar12._0_4_;
      auVar14 = ZEXT416((uint)(fVar18 * 1.5 + auVar14._0_4_ * -0.5 * fVar18 * fVar18 * fVar18));
      auVar14 = vshufps_avx(auVar14,auVar14,0);
      auVar15._0_4_ = local_78._0_4_ * auVar14._0_4_;
      auVar15._4_4_ = local_78._4_4_ * auVar14._4_4_;
      auVar15._8_4_ = local_78._8_4_ * auVar14._8_4_;
      auVar15._12_4_ = local_78._12_4_ * auVar14._12_4_;
      auVar14 = vdpps_avx(auVar15,(undefined1  [16])(split->axis0).field_0,0x7f);
      auVar12 = vdpps_avx(auVar15,(undefined1  [16])(split->axis1).field_0,0x7f);
      auVar20._8_4_ = 0x7fffffff;
      auVar20._0_8_ = 0x7fffffff7fffffff;
      auVar20._12_4_ = 0x7fffffff;
      auVar14 = vandps_avx(auVar14,auVar20);
      auVar12 = vandps_avx(auVar12,auVar20);
      if (auVar12._0_4_ < auVar14._0_4_) break;
      plVar1 = *(long **)(*(long *)(*(long *)this + 0x1e8) +
                         (ulong)*(uint *)((long)puVar9 + 0xc) * 8);
      (**(code **)(*plVar1 + 0x1c8))(local_78,plVar1,*(undefined4 *)((long)puVar9 + 0x1c));
      local_c8 = vminps_avx(local_c8,local_78);
      local_b8 = vmaxps_avx(local_b8,local_68);
      auVar14._0_4_ = local_78._0_4_ + local_68._0_4_;
      auVar14._4_4_ = local_78._4_4_ + local_68._4_4_;
      auVar14._8_4_ = local_78._8_4_ + local_68._8_4_;
      auVar14._12_4_ = local_78._12_4_ + local_68._12_4_;
      local_98 = vminps_avx(local_98,auVar14);
      local_88 = vmaxps_avx(local_88,auVar14);
      puVar9 = puVar9 + -4;
    }
    plVar1 = *(long **)(*(long *)(*(long *)this + 0x1e8) + (ulong)*(uint *)((long)puVar9 + 0xc) * 8)
    ;
    (**(code **)(*plVar1 + 0x1c8))(local_78,plVar1,*(undefined4 *)((long)puVar9 + 0x1c));
    local_a8 = vminps_avx(local_a8,local_78);
    local_d8 = vmaxps_avx(local_d8,local_68);
    auVar16._0_4_ = local_78._0_4_ + local_68._0_4_;
    auVar16._4_4_ = local_78._4_4_ + local_68._4_4_;
    auVar16._8_4_ = local_78._8_4_ + local_68._8_4_;
    auVar16._12_4_ = local_78._12_4_ + local_68._12_4_;
    local_e8 = vminps_avx(local_e8,auVar16);
    local_f8 = vmaxps_avx(local_f8,auVar16);
    plVar1 = *(long **)(*(long *)(*(long *)this + 0x1e8) + (ulong)*(uint *)((long)puVar10 + 0xc) * 8
                       );
    (**(code **)(*plVar1 + 0x1c8))(local_78,plVar1,*(undefined4 *)((long)puVar10 + 0x1c));
    local_c8 = vminps_avx(local_c8,local_78);
    local_b8 = vmaxps_avx(local_b8,local_68);
    auVar17._0_4_ = local_78._0_4_ + local_68._0_4_;
    auVar17._4_4_ = local_78._4_4_ + local_68._4_4_;
    auVar17._8_4_ = local_78._8_4_ + local_68._8_4_;
    auVar17._12_4_ = local_78._12_4_ + local_68._12_4_;
    local_98 = vminps_avx(local_98,auVar17);
    local_88 = vmaxps_avx(local_88,auVar17);
    uVar2 = *puVar10;
    uVar3 = puVar10[1];
    uVar4 = puVar10[2];
    uVar5 = puVar10[3];
    uVar6 = puVar9[1];
    uVar7 = puVar9[2];
    uVar8 = puVar9[3];
    *puVar10 = *puVar9;
    puVar10[1] = uVar6;
    puVar10[2] = uVar7;
    puVar10[3] = uVar8;
    *puVar9 = uVar2;
    puVar9[1] = uVar3;
    puVar9[2] = uVar4;
    puVar9[3] = uVar5;
    puVar10 = puVar10 + 4;
  } while( true );
}

Assistant:

void split(const Split& split, const PrimInfoRange& set, PrimInfoRange& lset, PrimInfoRange& rset) 
      {
        if (!split.valid()) {
          deterministic_order(set);
          return splitFallback(set,lset,rset);
        }
        
        const size_t begin = set.begin();
        const size_t end   = set.end();
        CentGeomBBox3fa local_left(empty);
        CentGeomBBox3fa local_right(empty);

        auto primOnLeftSide = [&] (const PrimRef& prim) -> bool { 
          const Vec3fa axisi = normalize(direction(prim));
          const float cos0 = abs(dot(axisi,split.axis0));
          const float cos1 = abs(dot(axisi,split.axis1));
          return cos0 > cos1;
        };

        auto mergePrimBounds = [this] (CentGeomBBox3fa& pinfo,const PrimRef& ref) { 
          pinfo.extend(bounds(ref)); 
        };
        
        size_t center = serial_partitioning(prims,begin,end,local_left,local_right,primOnLeftSide,mergePrimBounds);
        
        new (&lset) PrimInfoRange(begin,center,local_left);
        new (&rset) PrimInfoRange(center,end,local_right);
        assert(area(lset.geomBounds) >= 0.0f);
        assert(area(rset.geomBounds) >= 0.0f);
      }